

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O0

Vec_Int_t * Pdr_ManDeriveInfinityClauses(Pdr_Man_t *p,int fReduce)

{
  int iVar1;
  Vec_Ptr_t *vCubes_00;
  Vec_Int_t *p_00;
  void *pvVar2;
  int local_38;
  int kStart;
  int v;
  int i;
  Pdr_Set_t *pCube;
  Vec_Ptr_t *vCubes;
  Vec_Int_t *vResult;
  int fReduce_local;
  Pdr_Man_t *p_local;
  
  iVar1 = Pdr_ManFindInvariantStart(p);
  vCubes_00 = Pdr_ManCollectCubes(p,iVar1);
  if (fReduce != 0) {
    do {
      iVar1 = Pdr_ManDeriveMarkNonInductive(p,vCubes_00);
    } while (iVar1 != 0);
  }
  p_00 = Vec_IntAlloc(1000);
  Vec_IntPush(p_00,0);
  for (kStart = 0; iVar1 = Vec_PtrSize(vCubes_00), kStart < iVar1; kStart = kStart + 1) {
    pvVar2 = Vec_PtrEntry(vCubes_00,kStart);
    if (*(int *)((long)pvVar2 + 8) != -1) {
      Vec_IntAddToEntry(p_00,0,1);
      Vec_IntPush(p_00,*(int *)((long)pvVar2 + 0x10));
      for (local_38 = 0; local_38 < *(int *)((long)pvVar2 + 0x10); local_38 = local_38 + 1) {
        Vec_IntPush(p_00,*(int *)((long)pvVar2 + (long)local_38 * 4 + 0x14));
      }
    }
  }
  Vec_PtrFreeP(&p->vInfCubes);
  p->vInfCubes = vCubes_00;
  iVar1 = Aig_ManRegNum(p->pAig);
  Vec_IntPush(p_00,iVar1);
  return p_00;
}

Assistant:

Vec_Int_t * Pdr_ManDeriveInfinityClauses( Pdr_Man_t * p, int fReduce )
{
    Vec_Int_t * vResult;
    Vec_Ptr_t * vCubes;
    Pdr_Set_t * pCube;
    int i, v, kStart;
    // collect cubes used in the inductive invariant
    kStart = Pdr_ManFindInvariantStart( p );
    vCubes = Pdr_ManCollectCubes( p, kStart );
    // refine as long as there are changes
    if ( fReduce )
        while ( Pdr_ManDeriveMarkNonInductive(p, vCubes) );
    // collect remaining clauses
    vResult = Vec_IntAlloc( 1000 );
    Vec_IntPush( vResult, 0 );
    Vec_PtrForEachEntry( Pdr_Set_t *, vCubes, pCube, i )
    {
        if ( pCube->nRefs == -1 ) // skip non-inductive
            continue;
        Vec_IntAddToEntry( vResult, 0, 1 );
        Vec_IntPush( vResult, pCube->nLits );
        for ( v = 0; v < pCube->nLits; v++ )
            Vec_IntPush( vResult, pCube->Lits[v] );
    }
    //Vec_PtrFree( vCubes );
    Vec_PtrFreeP( &p->vInfCubes );
    p->vInfCubes = vCubes;
    Vec_IntPush( vResult, Aig_ManRegNum(p->pAig) );
    return vResult;
}